

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int htmlParseCharRef(htmlParserCtxtPtr ctxt)

{
  int local_1c;
  int val;
  htmlParserCtxtPtr ctxt_local;
  
  local_1c = 0;
  if ((ctxt == (htmlParserCtxtPtr)0x0) || (ctxt->input == (xmlParserInputPtr)0x0)) {
    htmlParseErr(ctxt,XML_ERR_INTERNAL_ERROR,"htmlParseCharRef: context error\n",(xmlChar *)0x0,
                 (xmlChar *)0x0);
    return 0;
  }
  if (((*ctxt->input->cur == '&') && (ctxt->input->cur[1] == '#')) &&
     ((ctxt->input->cur[2] == 'x' || (ctxt->input->cur[2] == 'X')))) {
    ctxt->input->cur = ctxt->input->cur + 3;
    ctxt->input->col = ctxt->input->col + 3;
    while (*ctxt->input->cur != ';') {
      if ((*ctxt->input->cur < 0x30) || (0x39 < *ctxt->input->cur)) {
        if ((*ctxt->input->cur < 0x61) || (0x66 < *ctxt->input->cur)) {
          if ((*ctxt->input->cur < 0x41) || (0x46 < *ctxt->input->cur)) {
            htmlParseErr(ctxt,XML_ERR_INVALID_HEX_CHARREF,"htmlParseCharRef: missing semicolon\n",
                         (xmlChar *)0x0,(xmlChar *)0x0);
            break;
          }
          if (local_1c < 0x110000) {
            local_1c = local_1c * 0x10 + (uint)*ctxt->input->cur + -0x37;
          }
        }
        else if (local_1c < 0x110000) {
          local_1c = local_1c * 0x10 + (uint)*ctxt->input->cur + -0x57;
        }
      }
      else if (local_1c < 0x110000) {
        local_1c = local_1c * 0x10 + (*ctxt->input->cur - 0x30);
      }
      xmlNextChar(ctxt);
    }
    if (*ctxt->input->cur == ';') {
      xmlNextChar(ctxt);
    }
  }
  else if ((*ctxt->input->cur == '&') && (ctxt->input->cur[1] == '#')) {
    ctxt->input->cur = ctxt->input->cur + 2;
    ctxt->input->col = ctxt->input->col + 2;
    while (*ctxt->input->cur != ';') {
      if ((*ctxt->input->cur < 0x30) || (0x39 < *ctxt->input->cur)) {
        htmlParseErr(ctxt,XML_ERR_INVALID_DEC_CHARREF,"htmlParseCharRef: missing semicolon\n",
                     (xmlChar *)0x0,(xmlChar *)0x0);
        break;
      }
      if (local_1c < 0x110000) {
        local_1c = local_1c * 10 + (*ctxt->input->cur - 0x30);
      }
      xmlNextChar(ctxt);
    }
    if (*ctxt->input->cur == ';') {
      xmlNextChar(ctxt);
    }
  }
  else {
    htmlParseErr(ctxt,XML_ERR_INVALID_CHARREF,"htmlParseCharRef: invalid value\n",(xmlChar *)0x0,
                 (xmlChar *)0x0);
  }
  if (local_1c < 0x100) {
    if ((((8 < local_1c) && (local_1c < 0xb)) || (local_1c == 0xd)) || (0x1f < local_1c)) {
      return local_1c;
    }
  }
  else {
    if ((0xff < local_1c) && (local_1c < 0xd800)) {
      return local_1c;
    }
    if ((0xdfff < local_1c) && (local_1c < 0xfffe)) {
      return local_1c;
    }
    if ((0xffff < local_1c) && (local_1c < 0x110000)) {
      return local_1c;
    }
  }
  if (local_1c < 0x110000) {
    htmlParseErrInt(ctxt,XML_ERR_INVALID_CHAR,"htmlParseCharRef: invalid xmlChar value %d\n",
                    local_1c);
  }
  else {
    htmlParseErr(ctxt,XML_ERR_INVALID_CHAR,"htmlParseCharRef: value too large\n",(xmlChar *)0x0,
                 (xmlChar *)0x0);
  }
  return 0;
}

Assistant:

int
htmlParseCharRef(htmlParserCtxtPtr ctxt) {
    int val = 0;

    if ((ctxt == NULL) || (ctxt->input == NULL)) {
	htmlParseErr(ctxt, XML_ERR_INTERNAL_ERROR,
		     "htmlParseCharRef: context error\n",
		     NULL, NULL);
        return(0);
    }
    if ((CUR == '&') && (NXT(1) == '#') &&
        ((NXT(2) == 'x') || NXT(2) == 'X')) {
	SKIP(3);
	while (CUR != ';') {
	    if ((CUR >= '0') && (CUR <= '9')) {
                if (val < 0x110000)
	            val = val * 16 + (CUR - '0');
            } else if ((CUR >= 'a') && (CUR <= 'f')) {
                if (val < 0x110000)
	            val = val * 16 + (CUR - 'a') + 10;
            } else if ((CUR >= 'A') && (CUR <= 'F')) {
                if (val < 0x110000)
	            val = val * 16 + (CUR - 'A') + 10;
            } else {
	        htmlParseErr(ctxt, XML_ERR_INVALID_HEX_CHARREF,
		             "htmlParseCharRef: missing semicolon\n",
			     NULL, NULL);
		break;
	    }
	    NEXT;
	}
	if (CUR == ';')
	    NEXT;
    } else if  ((CUR == '&') && (NXT(1) == '#')) {
	SKIP(2);
	while (CUR != ';') {
	    if ((CUR >= '0') && (CUR <= '9')) {
                if (val < 0x110000)
	            val = val * 10 + (CUR - '0');
            } else {
	        htmlParseErr(ctxt, XML_ERR_INVALID_DEC_CHARREF,
		             "htmlParseCharRef: missing semicolon\n",
			     NULL, NULL);
		break;
	    }
	    NEXT;
	}
	if (CUR == ';')
	    NEXT;
    } else {
	htmlParseErr(ctxt, XML_ERR_INVALID_CHARREF,
	             "htmlParseCharRef: invalid value\n", NULL, NULL);
    }
    /*
     * Check the value IS_CHAR ...
     */
    if (IS_CHAR(val)) {
        return(val);
    } else if (val >= 0x110000) {
	htmlParseErr(ctxt, XML_ERR_INVALID_CHAR,
		     "htmlParseCharRef: value too large\n", NULL, NULL);
    } else {
	htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
			"htmlParseCharRef: invalid xmlChar value %d\n",
			val);
    }
    return(0);
}